

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.h
# Opt level: O1

void __thiscall
UnifiedRegex::CharSet<unsigned_int>::CloneNonSurrogateCodeUnitsTo
          (CharSet<unsigned_int> *this,ArenaAllocator *allocator,CharSet<char16_t> *other)

{
  size_t sVar1;
  CharSetNode *pCVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  undefined8 in_RAX;
  undefined4 *puVar8;
  undefined1 auStack_38 [6];
  Char local_32 [3];
  char16 ignore;
  char16 outLower;
  
  sVar1 = this->characterPlanes[0].rep.compact.countPlusOne;
  _auStack_38 = in_RAX;
  if (sVar1 - 1 < 5) {
    uVar5 = (int)sVar1 - 1;
  }
  else {
    pCVar2 = this->characterPlanes[0].rep.full.root;
    if (pCVar2 == (CharSetNode *)0x0) {
      uVar5 = CharBitvec::Count(&this->characterPlanes[0].rep.full.direct);
    }
    else {
      if (pCVar2 != (CharSetNode *)&CharSetFull::Instance) {
        uVar6 = (*pCVar2->_vptr_CharSetNode[0xb])(pCVar2,2);
        if (0xff00 < uVar6) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                             ,0x252,
                             "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                             ,
                             "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                            );
          if (!bVar4) goto LAB_00ef22d9;
          *puVar8 = 0;
        }
      }
      uVar5 = CharBitvec::Count(&this->characterPlanes[0].rep.full.direct);
      pCVar2 = this->characterPlanes[0].rep.full.root;
      if (pCVar2 == (CharSetNode *)&CharSetFull::Instance) {
        iVar7 = 0xff00;
      }
      else {
        iVar7 = (*pCVar2->_vptr_CharSetNode[0xb])(pCVar2,2);
      }
      uVar5 = iVar7 + uVar5;
    }
  }
  if (uVar5 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                       ,0x28a,"(this->SimpleCharCount() > 0)","this->SimpleCharCount() > 0");
    if (!bVar4) goto LAB_00ef22d9;
    *puVar8 = 0;
  }
  auStack_38 = (undefined1  [6])((uint6)auStack_38 & 0xffffffff);
  _auStack_38 = CONCAT26(0xffff,auStack_38);
  bVar4 = CharSet<char16_t>::GetNextRange
                    (this->characterPlanes,L'\xd800',(Char *)(auStack_38 + 6),
                     (Char *)(auStack_38 + 4));
  if ((!bVar4) || (0xdfff < (ushort)local_32[0])) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                       ,0x28b,"(this->ContainSurrogateCodeUnits())",
                       "This doesn\'t contain surrogate code units, a simple clone is faster.");
    if (!bVar4) {
LAB_00ef22d9:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar8 = 0;
  }
  CharSet<char16_t>::CloneNonSurrogateCodeUnitsTo(this->characterPlanes,allocator,other);
  return;
}

Assistant:

inline void CloneNonSurrogateCodeUnitsTo(ArenaAllocator* allocator, CharSet<char16>& other)
        {
            Assert(this->SimpleCharCount() > 0);
            AssertMsg(this->ContainSurrogateCodeUnits(), "This doesn't contain surrogate code units, a simple clone is faster.");
            this->characterPlanes[0].CloneNonSurrogateCodeUnitsTo(allocator, other);
        }